

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O1

error_t ArgumentHandlers::BNB_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = state->input;
  if (key == 3) {
    *(undefined1 *)((long)pvVar1 + 0x20d) = 0;
  }
  else if (key == 2) {
    iVar2 = strcmp(arg,"Id");
    if (iVar2 == 0) {
      *(undefined4 *)((long)pvVar1 + 0x208) = 0;
    }
    else {
      iVar2 = strcmp(arg,"MaxC");
      if (iVar2 == 0) {
        *(undefined4 *)((long)pvVar1 + 0x208) = 1;
      }
      else {
        iVar2 = strcmp(arg,"MinC");
        if (iVar2 == 0) {
          *(undefined4 *)((long)pvVar1 + 0x208) = 2;
        }
        else {
          iVar2 = strcmp(arg,"MaxDiff");
          if (iVar2 == 0) {
            *(undefined4 *)((long)pvVar1 + 0x208) = 3;
          }
          else {
            iVar2 = strcmp(arg,"Prob");
            if (iVar2 == 0) {
              *(undefined4 *)((long)pvVar1 + 0x208) = 4;
            }
            else {
              iVar2 = strcmp(arg,"Basis");
              if (iVar2 == 0) {
                *(undefined4 *)((long)pvVar1 + 0x208) = 5;
              }
              else {
                iVar2 = strcmp(arg,"CMaxC");
                if (iVar2 == 0) {
                  *(undefined4 *)((long)pvVar1 + 0x208) = 6;
                }
                else {
                  iVar2 = strcmp(arg,"CMinC");
                  if (iVar2 == 0) {
                    *(undefined4 *)((long)pvVar1 + 0x208) = 7;
                  }
                  else {
                    iVar2 = strcmp(arg,"CMaxDiff");
                    if (iVar2 != 0) {
                      return 7;
                    }
                    *(undefined4 *)((long)pvVar1 + 0x208) = 8;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    if (key != 1) {
      return 7;
    }
    *(undefined1 *)((long)pvVar1 + 0x20c) = 1;
  }
  return 0;
}

Assistant:

error_t
BNB_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case BNB_KEEPALL:
        theArgumentsStruc->BnB_keepAll = true;
        break;
    case BNB_TYPE:
        if(strcmp(arg,"Id")==0)
            theArgumentsStruc->BnBJointTypeOrdering = IdentityMapping;
        else if(strcmp(arg,"MaxC")==0)
            theArgumentsStruc->BnBJointTypeOrdering = MaxContribution;
        else if(strcmp(arg,"MinC")==0)
            theArgumentsStruc->BnBJointTypeOrdering = MinContribution;
        else if(strcmp(arg,"MaxDiff")==0)
            theArgumentsStruc->BnBJointTypeOrdering = MaxContributionDifference;
        else if(strcmp(arg,"Prob")==0)
            theArgumentsStruc->BnBJointTypeOrdering = DescendingProbability;
        else if(strcmp(arg,"Basis")==0)
            theArgumentsStruc->BnBJointTypeOrdering = BasisTypes;
        else if(strcmp(arg,"CMaxC")==0)
            theArgumentsStruc->BnBJointTypeOrdering = ConsistentMaxContribution;
        else if(strcmp(arg,"CMinC")==0)
            theArgumentsStruc->BnBJointTypeOrdering = ConsistentMinContribution;
        else if(strcmp(arg,"CMaxDiff")==0)
            theArgumentsStruc->BnBJointTypeOrdering = ConsistentMaxContributionDifference;
        else
            return ARGP_ERR_UNKNOWN;
        break;
    case BNB_RECOMPUTE:
        theArgumentsStruc->BnB_consistentCompleteInformationHeur = false;
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}